

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

GCObject ** getgclist(GCObject *o)

{
  GCObject *pGVar1;
  
  pGVar1 = (GCObject *)0x0;
  switch(o->tt) {
  case '\x05':
    pGVar1 = (GCObject *)&o[2].tt;
    break;
  case '\a':
    pGVar1 = o + 2;
    break;
  case '\b':
    pGVar1 = (GCObject *)&o[4].tt;
    break;
  case '\t':
    break;
  case '\n':
    pGVar1 = (GCObject *)&o[7].tt;
    break;
  default:
    if (o->tt != '&') {
      return (GCObject **)0x0;
    }
  case '\x06':
    pGVar1 = o + 1;
  }
  return &pGVar1->next;
}

Assistant:

static GCObject **getgclist (GCObject *o) {
  switch (o->tt) {
    case LUA_VTABLE: return &gco2t(o)->gclist;
    case LUA_VLCL: return &gco2lcl(o)->gclist;
    case LUA_VCCL: return &gco2ccl(o)->gclist;
    case LUA_VTHREAD: return &gco2th(o)->gclist;
    case LUA_VPROTO: return &gco2p(o)->gclist;
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      lua_assert(u->nuvalue > 0);
      return &u->gclist;
    }
    default: lua_assert(0); return 0;
  }
}